

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_filename.c
# Opt level: O0

void test_read_format_zip_filename_CP866_CP1251(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  la_int64_t lVar4;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_16b57;
  pcVar3 = setlocale(6,"Russian_Russia");
  if ((pcVar3 == (char *)0x0) && (pcVar3 = setlocale(6,"ru_RU.CP1251"), pcVar3 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'͸');
    test_skipping("CP1251 locale not available on this system.");
    return;
  }
  extract_reference_file((char *)a);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'ͽ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
  iVar1 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'Ϳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
  iVar1 = archive_read_set_options((archive *)ae,"hdrcharset=CP866");
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ά',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ή',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'΋',anon_var_dwarf_21619,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ό',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'΍',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ύ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Α',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'Γ',anon_var_dwarf_2162f,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Δ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ε',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ζ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Κ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    iVar1 = archive_filter_code((archive *)ae,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ν',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",ae);
    iVar1 = archive_format((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ξ',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",ae);
    iVar1 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ρ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'΁');
    test_skipping("This system cannot convert character-set from CP866 to CP1251.");
  }
  iVar1 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'Σ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_filename_CP866_CP1251)
{
	const char *refname = "test_read_format_zip_filename_cp866.zip";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read CP866 filename in CP1251 with "hdrcharset=CP866" option.
	 */
	if (NULL == setlocale(LC_ALL, "Russian_Russia") &&
	    NULL == setlocale(LC_ALL, "ru_RU.CP1251")) {
		skipping("CP1251 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=CP866")) {
		skipping("This system cannot convert character-set"
		    " from CP866 to CP1251.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xcf\xd0\xc8\xc2\xc5\xd2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xef\xf0\xe8\xe2\xe5\xf2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}